

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestHierarchyIterator.cpp
# Opt level: O3

void __thiscall
tcu::DefaultHierarchyInflater::enterTestPackage
          (DefaultHierarchyInflater *this,TestPackage *testPackage,
          vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *children)

{
  int iVar1;
  undefined4 extraout_var;
  Archive *pAVar2;
  
  iVar1 = (*(testPackage->super_TestNode)._vptr_TestNode[6])(testPackage);
  pAVar2 = (Archive *)CONCAT44(extraout_var,iVar1);
  if (pAVar2 == (Archive *)0x0) {
    pAVar2 = this->m_testCtx->m_rootArchive;
  }
  this->m_testCtx->m_curArchive = pAVar2;
  (*(testPackage->super_TestNode)._vptr_TestNode[2])(testPackage);
  TestNode::getChildren(&testPackage->super_TestNode,children);
  return;
}

Assistant:

void DefaultHierarchyInflater::enterTestPackage (TestPackage* testPackage, vector<TestNode*>& children)
{
	{
		Archive* const	pkgArchive	= testPackage->getArchive();

		if (pkgArchive)
			m_testCtx.setCurrentArchive(*pkgArchive);
		else
			m_testCtx.setCurrentArchive(m_testCtx.getRootArchive());
	}

	testPackage->init();
	testPackage->getChildren(children);
}